

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O3

_Bool arm_generate_debug_exceptions(CPUARMState_conflict *env)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  ulong uVar6;
  _Bool _Var7;
  bool bVar8;
  
  if (env->aarch64 == 0) {
    uVar1 = env->features;
    if (((uint)uVar1 >> 9 & 1) == 0) {
      uVar2 = env->uncached_cpsr & 0x1f;
      if (uVar2 == 0x10) {
LAB_0060e0d7:
        uVar6 = uVar1 >> 0x1c & 0xffffffff;
        if ((uVar1 & 0x200000000) != 0) {
          uVar6 = 0;
        }
        if ((~uVar1 & 0x210000000) == 0) {
          uVar6 = (ulong)((uint)(env->cp15).scr_el3 >> 10);
        }
        if (((uVar1 >> 0x20 & 1) != 0) &&
           (((uVar1 & 0x200000000) == 0 || (((env->cp15).scr_el3 & 1) != 0)))) {
          bVar8 = true;
          _Var7 = true;
          if ((uVar6 & 1) == 0) goto LAB_0060e13e;
          uVar6 = (env->cp15).hcr_el2 >> 0x1f;
        }
        bVar8 = true;
        _Var7 = true;
        if ((uVar6 & 1) == 0) goto LAB_0060e13e;
        goto aa64_generate_debug_exceptions;
      }
      if (uVar2 == 0x1a) {
        bVar8 = false;
        _Var7 = false;
        goto LAB_0060e13e;
      }
    }
    else if (((env->v7m).exception == 0) && (((env->v7m).control[(env->v7m).secure] & 1) != 0))
    goto LAB_0060e0d7;
    _Var7 = true;
    bVar8 = false;
LAB_0060e13e:
    if ((((uVar1 & 0x200000000) != 0) &&
        (((env->uncached_cpsr & 0x1f) == 0x16 || (((env->cp15).scr_el3 & 1) == 0)))) &&
       ((!bVar8 || (_Var7 = true, ((env->cp15).sder & 1) == 0)))) {
      _Var7 = ((env->cp15).mdcr_el3 & 0xc000) != 0x8000;
    }
    return _Var7;
  }
aa64_generate_debug_exceptions:
  uVar1 = env->features;
  uVar2 = (uint)uVar1;
  if ((uVar2 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar4 = env->uncached_cpsr & 0x1f;
      uVar3 = 0;
      if (uVar4 != 0x10) {
        if (uVar4 == 0x16) {
          return false;
        }
        if (uVar4 == 0x1a) {
          uVar3 = 2;
        }
        else {
          uVar3 = 1;
          if ((uVar1 >> 0x21 & 1) != 0) {
            if (uVar4 == 0x16) {
              if ((uVar2 >> 0x1c & 1) == 0) {
                return false;
              }
            }
            else if ((uVar1 & 0x10000000) == 0 && ((env->cp15).scr_el3 & 1) == 0) {
              return false;
            }
          }
        }
      }
    }
    else {
      uVar3 = env->pstate >> 2 & 3;
      if (uVar3 == 3) {
        return false;
      }
    }
  }
  else {
    uVar3 = 1;
    if ((env->v7m).exception == 0) {
      uVar3 = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
  }
  if ((uVar1 >> 0x21 & 1) == 0) {
    bVar8 = false;
LAB_0060e559:
    if (((uVar1 >> 0x20 & 1) != 0 && !bVar8) &&
       ((uVar4 = 2, ((env->cp15).hcr_el2 & 0x8000000) != 0 || (((env->cp15).mdcr_el2 & 0x100) != 0))
       )) goto LAB_0060e62c;
    bVar5 = bVar8;
    if ((uVar1 & 0x200000000) != 0) goto LAB_0060e615;
  }
  else {
    bVar8 = ((env->cp15).scr_el3 & 1) == 0;
    if ((bVar8) && (((env->cp15).mdcr_el3 & 0x10000) != 0)) {
      return false;
    }
    if (env->aarch64 == 0) {
      bVar5 = true;
      if ((env->uncached_cpsr & 0x1f) != 0x16) goto LAB_0060e559;
    }
    else {
      bVar5 = true;
      if ((~env->pstate & 0xc) != 0) goto LAB_0060e559;
    }
LAB_0060e615:
    if (((uVar2 >> 0x1c & 1) == 0) && (uVar4 = 3, bVar5)) goto LAB_0060e62c;
  }
  uVar4 = 1;
LAB_0060e62c:
  if (uVar3 != uVar4) {
    return uVar3 < uVar4;
  }
  if (((env->cp15).mdscr_el1 & 0x2000) == 0) {
    return false;
  }
  return (env->daif & 0x200) == 0;
}

Assistant:

static inline bool arm_generate_debug_exceptions(CPUARMState *env)
{
    if (env->aarch64) {
        return aa64_generate_debug_exceptions(env);
    } else {
        return aa32_generate_debug_exceptions(env);
    }
}